

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

void __thiscall gvr::anon_unknown_3::PLYValueList::~PLYValueList(PLYValueList *this)

{
  pointer ppPVar1;
  ulong uVar2;
  
  (this->super_PLYValue)._vptr_PLYValue = (_func_int **)&PTR__PLYValueList_00131660;
  if (this->size != (PLYValue *)0x0) {
    (*this->size->_vptr_PLYValue[1])();
  }
  ppPVar1 = (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar1) {
    uVar2 = 0;
    do {
      if (ppPVar1[uVar2] != (PLYValue *)0x0) {
        (*ppPVar1[uVar2]->_vptr_PLYValue[1])();
      }
      uVar2 = uVar2 + 1;
      ppPVar1 = (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->list).
                                   super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3))
    ;
  }
  if (ppPVar1 != (pointer)0x0) {
    operator_delete(ppPVar1);
    return;
  }
  return;
}

Assistant:

~PLYValueList()
    {
      delete size;

      for (size_t i=0; i<list.size(); i++)
      {
        delete list[i];
      }
    }